

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

bool filemgr_is_cow_supported(filemgr *src,filemgr *dst)

{
  int iVar1;
  
  iVar1 = (*src->ops->get_fs_type)(src->fd);
  src->fs_type = iVar1;
  if (-1 < iVar1) {
    iVar1 = (*dst->ops->get_fs_type)(dst->fd);
    dst->fs_type = iVar1;
    if (-1 < iVar1) {
      return src->fs_type != 1 && src->fs_type == iVar1;
    }
  }
  return false;
}

Assistant:

bool filemgr_is_cow_supported(struct filemgr *src, struct filemgr *dst)
{
    src->fs_type = src->ops->get_fs_type(src->fd);
    if (src->fs_type < 0) {
        return false;
    }
    dst->fs_type = dst->ops->get_fs_type(dst->fd);
    if (dst->fs_type < 0) {
        return false;
    }
    if (src->fs_type == dst->fs_type && src->fs_type != FILEMGR_FS_NO_COW) {
        return true;
    }
    return false;
}